

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,ForLoopStatement *stmt)

{
  pointer ppEVar1;
  size_t sVar2;
  pointer ppVVar3;
  __extent_storage<18446744073709551615UL> _Var4;
  uint exitState;
  bool bVar5;
  Expression *this_00;
  EVP_PKEY_CTX *ctx;
  uint uVar6;
  int iVar7;
  long lVar8;
  span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> loopVars;
  type oldBreakStates;
  SmallVector<int,_10UL> local_70;
  
  ppEVar1 = (stmt->initializers)._M_ptr;
  sVar2 = (stmt->initializers)._M_extent._M_extent_value;
  for (lVar8 = 0; sVar2 << 3 != lVar8; lVar8 = lVar8 + 8) {
    ast::Expression::visit<TestAnalysis&>
              (*(Expression **)((long)ppEVar1 + lVar8),(TestAnalysis *)this);
  }
  ppVVar3 = (stmt->loopVars)._M_ptr;
  sVar2 = (stmt->loopVars)._M_extent._M_extent_value;
  for (lVar8 = 0; sVar2 << 3 != lVar8; lVar8 = lVar8 + 8) {
    this_00 = ast::DeclaredType::getInitializer
                        ((DeclaredType *)(*(long *)((long)ppVVar3 + lVar8) + 0x40));
    if (this_00 != (Expression *)0x0) {
      ast::Expression::visit<TestAnalysis&>(this_00,(TestAnalysis *)this);
    }
  }
  if (stmt->stopExpr == (Expression *)0x0) {
    iVar7 = this->state;
    uVar6 = 0;
    bVar5 = false;
  }
  else {
    visitCondition((ConstantValue *)&local_70,this,stmt->stopExpr);
    iVar7 = this->stateWhenTrue;
    uVar6 = this->stateWhenFalse;
    _Var4._M_extent_value = (stmt->loopVars)._M_extent._M_extent_value;
    if (_Var4._M_extent_value == 0 || local_70._32_1_ != '\0') {
      bVar5 = false;
    }
    else {
      loopVars._M_extent._M_extent_value = _Var4._M_extent_value;
      loopVars._M_ptr = (stmt->loopVars)._M_ptr;
      bVar5 = analysis::FlowAnalysisBase::willIterateAtLeastOnce
                        (&this->super_FlowAnalysisBase,loopVars,stmt->stopExpr);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_70);
  }
  SmallVector<int,_10UL>::SmallVector(&local_70,&(this->breakStates).super_SmallVectorBase<int>);
  (this->breakStates).super_SmallVectorBase<int>.len = 0;
  this->isStateSplit = false;
  this->state = iVar7;
  this->stateWhenTrue = 0;
  this->stateWhenFalse = 0;
  ast::Statement::visit<TestAnalysis&>(stmt->body,(TestAnalysis *)this);
  ppEVar1 = (stmt->steps)._M_ptr;
  sVar2 = (stmt->steps)._M_extent._M_extent_value;
  for (lVar8 = 0; sVar2 << 3 != lVar8; lVar8 = lVar8 + 8) {
    ast::Expression::visit<TestAnalysis&>
              (*(Expression **)((long)ppEVar1 + lVar8),(TestAnalysis *)this);
  }
  exitState = this->state;
  if ((int)uVar6 <= this->state) {
    exitState = uVar6;
  }
  if (bVar5 == false) {
    exitState = uVar6;
  }
  ctx = (EVP_PKEY_CTX *)(ulong)exitState;
  loopTail(this,exitState,&local_70);
  SmallVectorBase<int>::cleanup(&local_70.super_SmallVectorBase<int>,ctx);
  return;
}

Assistant:

void visitStmt(const ForLoopStatement& stmt) {
        for (auto init : stmt.initializers)
            visit(*init);

        for (auto var : stmt.loopVars) {
            if (auto init = var->getInitializer())
                visit(*init);
        }

        bool bodyWillExecute = false;
        TState bodyState, exitState;
        if (stmt.stopExpr) {
            auto cv = visitCondition(*stmt.stopExpr);
            bodyState = std::move(stateWhenTrue);
            exitState = std::move(stateWhenFalse);

            // If we had a non-constant stop expression we want
            // to check whether there's at least a guarantee that
            // we will visit the loop body at least once, because then
            // we can allow the body state to definitely affect the
            // post-loop exit state.
            if (!cv && !stmt.loopVars.empty() &&
                willIterateAtLeastOnce(stmt.loopVars, *stmt.stopExpr)) {
                bodyWillExecute = true;
            }
        }
        else {
            // If there's no stop expression, the loop is infinite.
            bodyState = std::move(state);
            exitState = (DERIVED).unreachableState();
        }

        auto oldBreakStates = std::move(breakStates);
        breakStates.clear();
        setState(std::move(bodyState));
        visit(stmt.body);

        for (auto step : stmt.steps)
            visit(*step);

        if (bodyWillExecute)
            (DERIVED).meetState(exitState, state);

        loopTail(std::move(exitState), std::move(oldBreakStates));
    }